

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O2

bool __thiscall
duckdb::StringValueResult::HandleTooManyColumnsError
          (StringValueResult *this,char *value_ptr,idx_t size)

{
  CSVStateMachine *pCVar1;
  bool bVar2;
  bool bVar3;
  undefined8 in_RAX;
  idx_t i;
  ulong uVar4;
  undefined8 uStack_28;
  
  if ((this->cur_col_id < (ulong)this->number_of_columns) ||
     (pCVar1 = (this->super_ScannerResult).state_machine,
     (pCVar1->state_machine_options).strict_mode.value != true)) {
    bVar3 = false;
  }
  else {
    uStack_28 = in_RAX;
    if ((this->cur_col_id == (ulong)this->number_of_columns) &&
       (((this->super_ScannerResult).quoted != true || (pCVar1->options->allow_quoted_nulls == true)
        ))) {
      bVar3 = false;
      for (uVar4 = 0; uVar4 < this->null_str_count; uVar4 = uVar4 + 1) {
        bVar2 = true;
        if (bVar3 == false) {
          bVar2 = IsValueNull((this->null_str_ptr).
                              super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                              ._M_t.
                              super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>
                              .super__Head_base<0UL,_const_char_**,_false>._M_head_impl[uVar4],
                              value_ptr,size);
        }
        bVar3 = bVar2;
      }
      if (bVar3 != false) {
        return true;
      }
    }
    uStack_28 = CONCAT17(3,(undefined7)uStack_28);
    LineError::Insert(&this->current_errors,(CSVErrorType *)((long)&uStack_28 + 7),&this->cur_col_id
                      ,&this->chunk_col_id,&(this->super_ScannerResult).last_position,0);
    this->cur_col_id = this->cur_col_id + 1;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool StringValueResult::HandleTooManyColumnsError(const char *value_ptr, const idx_t size) {
	if (cur_col_id >= number_of_columns && state_machine.state_machine_options.strict_mode.GetValue()) {
		bool error = true;
		if (cur_col_id == number_of_columns && ((quoted && state_machine.options.allow_quoted_nulls) || !quoted)) {
			// we make an exception if the first over-value is null
			bool is_value_null = false;
			for (idx_t i = 0; i < null_str_count; i++) {
				is_value_null = is_value_null || IsValueNull(null_str_ptr[i], value_ptr, size);
			}
			error = !is_value_null;
		}
		if (error) {
			// We error pointing to the current value error.
			current_errors.Insert(TOO_MANY_COLUMNS, cur_col_id, chunk_col_id, last_position);
			cur_col_id++;
		}
		// We had an error
		return true;
	}
	return false;
}